

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

DoubleFeatureType * __thiscall
CoreML::Specification::DoubleFeatureType::New(DoubleFeatureType *this,Arena *arena)

{
  DoubleFeatureType *this_00;
  
  this_00 = (DoubleFeatureType *)operator_new(0x18);
  DoubleFeatureType(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::DoubleFeatureType>(arena,this_00);
  }
  return this_00;
}

Assistant:

DoubleFeatureType* DoubleFeatureType::New(::google::protobuf::Arena* arena) const {
  DoubleFeatureType* n = new DoubleFeatureType;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}